

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O3

void av1_make_masked_inter_predictor
               (uint8_t *pre,int pre_stride,uint8_t *dst,int dst_stride,
               InterPredParams *inter_pred_params,SubpelParams *subpel_params)

{
  ConvolveParams *pCVar1;
  BLOCK_SIZE BVar2;
  uint32_t uVar3;
  CONV_BUF_TYPE *pCVar4;
  INTERINTER_COMPOUND_DATA *pIVar5;
  CONV_BUF_TYPE *dst_00;
  uint8_t tmp_buf [32768];
  CONV_BUF_TYPE local_8060 [16408];
  
  BVar2 = inter_pred_params->sb_type;
  dst_00 = (CONV_BUF_TYPE *)((ulong)local_8060 >> 1);
  if (inter_pred_params->use_hbd_buf == 0) {
    dst_00 = local_8060;
  }
  pCVar1 = &inter_pred_params->conv_params;
  pCVar4 = (inter_pred_params->conv_params).dst;
  uVar3 = (inter_pred_params->conv_params).dst_stride;
  (inter_pred_params->conv_params).dst = local_8060;
  (inter_pred_params->conv_params).dst_stride = 0x80;
  av1_make_inter_predictor(pre,pre_stride,(uint8_t *)dst_00,0x80,inter_pred_params,subpel_params);
  if (((inter_pred_params->conv_params).plane == 0) &&
     ((inter_pred_params->mask_comp).type == '\x03')) {
    (*av1_build_compound_diffwtd_mask_d16)
              ((inter_pred_params->mask_comp).seg_mask,(inter_pred_params->mask_comp).mask_type,
               pCVar4,uVar3,local_8060,0x80,inter_pred_params->block_height,
               inter_pred_params->block_width,pCVar1,inter_pred_params->bit_depth);
  }
  if ((inter_pred_params->mask_comp).type == '\x02') {
    pIVar5 = (INTERINTER_COMPOUND_DATA *)
             (av1_wedge_params_lookup[BVar2].masks[(inter_pred_params->mask_comp).wedge_sign] +
             (inter_pred_params->mask_comp).wedge_index);
  }
  else {
    pIVar5 = &inter_pred_params->mask_comp;
  }
  if (inter_pred_params->use_hbd_buf == 0) {
    (*aom_lowbd_blend_a64_d16_mask)
              (dst,dst_stride,pCVar4,uVar3,local_8060,0x80,pIVar5->seg_mask,
               (uint32_t)block_size_wide[BVar2],inter_pred_params->block_width,
               inter_pred_params->block_height,inter_pred_params->subsampling_x,
               inter_pred_params->subsampling_y,pCVar1);
  }
  else {
    (*aom_highbd_blend_a64_d16_mask)
              (dst,dst_stride,pCVar4,uVar3,local_8060,0x80,pIVar5->seg_mask,
               (uint32_t)block_size_wide[BVar2],inter_pred_params->block_width,
               inter_pred_params->block_height,inter_pred_params->subsampling_x,
               inter_pred_params->subsampling_y,pCVar1,inter_pred_params->bit_depth);
  }
  return;
}

Assistant:

void av1_make_masked_inter_predictor(const uint8_t *pre, int pre_stride,
                                     uint8_t *dst, int dst_stride,
                                     InterPredParams *inter_pred_params,
                                     const SubpelParams *subpel_params) {
  const INTERINTER_COMPOUND_DATA *comp_data = &inter_pred_params->mask_comp;
  BLOCK_SIZE sb_type = inter_pred_params->sb_type;

  // We're going to call av1_make_inter_predictor to generate a prediction into
  // a temporary buffer, then will blend that temporary buffer with that from
  // the other reference.
  DECLARE_ALIGNED(32, uint8_t, tmp_buf[2 * MAX_SB_SQUARE]);
  uint8_t *tmp_dst =
      inter_pred_params->use_hbd_buf ? CONVERT_TO_BYTEPTR(tmp_buf) : tmp_buf;

  const int tmp_buf_stride = MAX_SB_SIZE;
  CONV_BUF_TYPE *org_dst = inter_pred_params->conv_params.dst;
  int org_dst_stride = inter_pred_params->conv_params.dst_stride;
  CONV_BUF_TYPE *tmp_buf16 = (CONV_BUF_TYPE *)tmp_buf;
  inter_pred_params->conv_params.dst = tmp_buf16;
  inter_pred_params->conv_params.dst_stride = tmp_buf_stride;
  assert(inter_pred_params->conv_params.do_average == 0);

  // This will generate a prediction in tmp_buf for the second reference
  av1_make_inter_predictor(pre, pre_stride, tmp_dst, MAX_SB_SIZE,
                           inter_pred_params, subpel_params);

  if (!inter_pred_params->conv_params.plane &&
      comp_data->type == COMPOUND_DIFFWTD) {
    av1_build_compound_diffwtd_mask_d16(
        comp_data->seg_mask, comp_data->mask_type, org_dst, org_dst_stride,
        tmp_buf16, tmp_buf_stride, inter_pred_params->block_height,
        inter_pred_params->block_width, &inter_pred_params->conv_params,
        inter_pred_params->bit_depth);
  }
  build_masked_compound_no_round(
      dst, dst_stride, org_dst, org_dst_stride, tmp_buf16, tmp_buf_stride,
      comp_data, sb_type, inter_pred_params->block_height,
      inter_pred_params->block_width, inter_pred_params);
}